

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void __thiscall duckdb::Executor::Flush(Executor *this,ThreadContext *thread_context)

{
  __int_type _Var1;
  QueryProfiler *pQVar2;
  long lVar3;
  undefined1 auVar4 [16];
  shared_ptr<duckdb::QueryProfiler,_true> global_profiler;
  __shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2> local_30;
  double local_20;
  
  ::std::__shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             (__shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2> *)&this->profiler);
  if (local_30._M_ptr != (element_type *)0x0) {
    pQVar2 = shared_ptr<duckdb::QueryProfiler,_true>::operator->
                       ((shared_ptr<duckdb::QueryProfiler,_true> *)&local_30);
    QueryProfiler::Flush(pQVar2,&thread_context->profiler);
    _Var1 = (this->blocked_thread_time).super___atomic_base<unsigned_long>._M_i;
    pQVar2 = shared_ptr<duckdb::QueryProfiler,_true>::operator->
                       ((shared_ptr<duckdb::QueryProfiler,_true> *)&local_30);
    lVar3 = _Var1 * 0x14;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    local_20 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000.0;
    QueryProfiler::SetInfo(pQVar2,&local_20);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void Executor::Flush(ThreadContext &thread_context) {
	static constexpr std::chrono::milliseconds WAIT_TIME_MS = std::chrono::milliseconds(WAIT_TIME);
	auto global_profiler = profiler;
	if (global_profiler) {
		global_profiler->Flush(thread_context.profiler);

		auto blocked_time = blocked_thread_time.load();
		global_profiler->SetInfo(double(blocked_time * WAIT_TIME_MS.count()) / 1000);
	}
}